

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_ror_a_c_set_clears_c_and_sets_z_flags_Test::
CpuTest_ror_a_c_set_clears_c_and_sets_z_flags_Test
          (CpuTest_ror_a_c_set_clears_c_and_sets_z_flags_Test *this)

{
  CpuTest_ror_a_c_set_clears_c_and_sets_z_flags_Test *this_local;
  
  n_e_s::core::test::CpuTest::CpuTest(&this->super_CpuTest);
  (this->super_CpuTest).super_Test._vptr_Test =
       (_func_int **)&PTR__CpuTest_ror_a_c_set_clears_c_and_sets_z_flags_Test_003e9d58;
  return;
}

Assistant:

TEST_F(CpuTest, ror_a_c_set_clears_c_and_sets_z_flags) {
    stage_instruction(ROR_ACC);
    registers.a = 0b00000000;
    registers.p = C_FLAG;
    expected.a = 0b10000000;
    expected.p = N_FLAG;

    step_execution(2);
    EXPECT_EQ(expected, registers);
}